

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_Tt6CnfSize(word t,int nVars)

{
  int nCubes;
  int local_1c;
  
  local_1c = 0;
  Abc_Tt6Isop(t,t,nVars,&local_1c);
  Abc_Tt6Isop(~t,~t,nVars,&local_1c);
  if (local_1c < 0x41) {
    return local_1c;
  }
  __assert_fail("nCubes <= 64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                ,0x76f,"int Abc_Tt6CnfSize(word, int)");
}

Assistant:

static inline int Abc_Tt6CnfSize( word t, int nVars )
{
    int nCubes = 0;
    Abc_Tt6Isop(  t,  t, nVars, &nCubes );
    Abc_Tt6Isop( ~t, ~t, nVars, &nCubes );
    assert( nCubes <= 64 );
    return nCubes;
}